

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdef.c
# Opt level: O2

int av1_cdef_compute_sb_list
              (CommonModeInfoParams *mi_params,int mi_row,int mi_col,cdef_list *dlist,BLOCK_SIZE bs)

{
  MB_MODE_INFO **ppMVar1;
  MB_MODE_INFO **ppMVar2;
  int iVar3;
  MB_MODE_INFO **ppMVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  MB_MODE_INFO **ppMVar9;
  int c_1;
  long lVar10;
  int c;
  ulong uVar11;
  
  iVar3 = mi_params->mi_cols - mi_col;
  if ((bs & ~BLOCK_4X8) == BLOCK_128X64) {
    if (0x1f < iVar3) {
      iVar3 = 0x20;
    }
  }
  else if (0xf < iVar3) {
    iVar3 = 0x10;
  }
  ppMVar2 = mi_params->mi_grid_base;
  iVar7 = mi_params->mi_rows - mi_row;
  if ((bs & ~BLOCK_8X4) == BLOCK_64X128) {
    iVar6 = 0x20;
    if (iVar7 < 0x20) {
      iVar6 = iVar7;
    }
  }
  else {
    iVar6 = 0x10;
    if (iVar7 < 0x10) {
      iVar6 = iVar7;
    }
  }
  iVar7 = 0;
  uVar8 = 0;
  do {
    if (iVar6 <= (int)uVar8) {
      return iVar7;
    }
    ppMVar4 = ppMVar2 + mi_col;
    for (uVar11 = 0; (long)uVar11 < (long)iVar3; uVar11 = uVar11 + 2) {
      ppMVar9 = ppMVar4 + mi_row * mi_params->mi_stride;
      for (iVar5 = 0; iVar5 != 2; iVar5 = iVar5 + 1) {
        lVar10 = 0;
        while (lVar10 != 2) {
          ppMVar1 = ppMVar9 + lVar10;
          lVar10 = lVar10 + 1;
          if ((*ppMVar1)->skip_txfm == '\0') {
            dlist[iVar7].by = (uint8_t)(uVar8 >> 1);
            dlist[iVar7].bx = (uint8_t)(uVar11 >> 1);
            iVar7 = iVar7 + 1;
            goto LAB_00326ea9;
          }
        }
        ppMVar9 = ppMVar9 + mi_params->mi_stride;
      }
LAB_00326ea9:
      ppMVar4 = ppMVar4 + 2;
    }
    uVar8 = uVar8 + 2;
    mi_row = mi_row + 2;
  } while( true );
}

Assistant:

int av1_cdef_compute_sb_list(const CommonModeInfoParams *const mi_params,
                             int mi_row, int mi_col, cdef_list *dlist,
                             BLOCK_SIZE bs) {
  MB_MODE_INFO **grid = mi_params->mi_grid_base;
  int maxc = mi_params->mi_cols - mi_col;
  int maxr = mi_params->mi_rows - mi_row;

  if (bs == BLOCK_128X128 || bs == BLOCK_128X64)
    maxc = AOMMIN(maxc, MI_SIZE_128X128);
  else
    maxc = AOMMIN(maxc, MI_SIZE_64X64);
  if (bs == BLOCK_128X128 || bs == BLOCK_64X128)
    maxr = AOMMIN(maxr, MI_SIZE_128X128);
  else
    maxr = AOMMIN(maxr, MI_SIZE_64X64);

  const int r_step = 2;  // mi_size_high[BLOCK_8X8]
  const int c_step = 2;  // mi_size_wide[BLOCK_8X8]
  const int r_shift = 1;
  const int c_shift = 1;
  int count = 0;
  for (int r = 0; r < maxr; r += r_step) {
    for (int c = 0; c < maxc; c += c_step) {
      if (!is_8x8_block_skip(grid, mi_row + r, mi_col + c,
                             mi_params->mi_stride)) {
        dlist[count].by = r >> r_shift;
        dlist[count].bx = c >> c_shift;
        count++;
      }
    }
  }
  return count;
}